

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O1

bool matchit::impl::
     matchPatternRangeImpl<0ul,0ul,1ul,int_const*&,std::tuple<matchit::impl::Id<int>,matchit::impl::Id<int>>const&,matchit::impl::Context<mathiu::impl::Fraction_const*,bool>>
               (long *rangeBegin,Id<int> *patternTuple,int depth)

{
  bool bVar1;
  
  bVar1 = Id<int>::matchValue<int_const&>(patternTuple + 1,(int *)*rangeBegin);
  PatternTraits<matchit::impl::Id<int>_>::processIdImpl(patternTuple + 1,depth + 1,(uint)bVar1);
  if (bVar1) {
    bVar1 = Id<int>::matchValue<int_const&>(patternTuple,(int *)(*rangeBegin + 4));
    PatternTraits<matchit::impl::Id<int>_>::processIdImpl(patternTuple,depth + 1,(uint)bVar1);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

constexpr decltype(auto) matchPatternRangeImpl(RangeBegin &&rangeBegin,
                                                       PatternTuple &&patternTuple,
                                                       int32_t depth, ContextT &context,
                                                       std::index_sequence<I...>)
        {
            auto const func = [&](auto &&value, auto &&pattern)
            {
                return matchPattern(std::forward<decltype(value)>(value), pattern,
                                    depth + 1, context);
            };
            static_cast<void>(func);
            // Fix Me, avoid call next from begin every time.
            return (func(*std::next(rangeBegin, static_cast<long>(I)),
                         std::get<I + patternStartIdx>(patternTuple)) &&
                    ...);
        }